

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascOpenStorage.cpp
# Opt level: O1

TCHAR * CheckForIndexDirectory(TCascStorage *hs,TCHAR *szSubDir)

{
  bool bVar1;
  TCHAR *szDirectory;
  
  szDirectory = CombinePath(hs->szDataPath,szSubDir);
  bVar1 = DirectoryExists(szDirectory);
  if (!bVar1) {
    free(szDirectory);
    szDirectory = (TCHAR *)0x0;
  }
  return szDirectory;
}

Assistant:

static TCHAR * CheckForIndexDirectory(TCascStorage * hs, const TCHAR * szSubDir)
{
    TCHAR * szIndexPath;

    // Combine the index path
    szIndexPath = CombinePath(hs->szDataPath, szSubDir);
    if (!DirectoryExists(szIndexPath))
    {
        CASC_FREE(szIndexPath);
        szIndexPath = NULL;
    }

    return szIndexPath;
}